

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::sendMouseEvent
          (QGraphicsScenePrivate *this,QGraphicsSceneMouseEvent *mouseEvent)

{
  long lVar1;
  QGraphicsItem *this_00;
  QGraphicsItemPrivate *this_01;
  MouseButton MVar2;
  bool bVar3;
  MouseButton MVar4;
  QFlagsStorage<Qt::MouseButton> QVar5;
  QWidget *viewport;
  QPoint QVar6;
  long lVar7;
  qreal *pqVar8;
  QPointF *pQVar9;
  int i;
  long in_FS_OFFSET;
  byte bVar10;
  qreal qVar11;
  QPointF local_c0;
  MouseButton button;
  QPointF local_a8;
  QPointF local_98;
  QTransform mapFromScene;
  
  bVar10 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MVar4 = QGraphicsSceneMouseEvent::button(mouseEvent);
  if (MVar4 == NoButton) {
    QVar5.i = (Int)QGraphicsSceneMouseEvent::buttons(mouseEvent);
    if (((QFlagsStorage<Qt::MouseButton>)QVar5.i == (QFlagsStorage<Qt::MouseButton>)0x0) &&
       ((this->field_0xb9 & 8) != 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        clearMouseGrabber(this);
        return;
      }
      goto LAB_00595a76;
    }
  }
  this_00 = (this->mouseGrabberItems).d.ptr[(this->mouseGrabberItems).d.size + -1];
  bVar3 = QGraphicsItem::isBlockedByModalPanel(this_00,(QGraphicsItem **)0x0);
  if (!bVar3) {
    pqVar8 = (qreal *)&DAT_006795c0;
    pQVar9 = (QPointF *)&mapFromScene;
    for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
      pQVar9->xp = *pqVar8;
      pqVar8 = pqVar8 + (ulong)bVar10 * -2 + 1;
      pQVar9 = (QPointF *)&pQVar9[-(ulong)bVar10].yp;
    }
    this_01 = (this_00->d_ptr).d;
    viewport = QGraphicsSceneEvent::widget(&mouseEvent->super_QGraphicsSceneEvent);
    QGraphicsItemPrivate::genericMapFromSceneTransform(&mapFromScene,this_01,viewport);
    local_a8 = QGraphicsSceneMouseEvent::scenePos(mouseEvent);
    qVar11 = local_a8.yp;
    local_98.xp = (qreal)QTransform::map((QPointF *)&mapFromScene);
    local_98.yp = qVar11;
    for (MVar4 = LeftButton; MVar4 < (ExtraButton2|LeftButton); MVar4 = MVar4 * 2) {
      button = MVar4;
      local_a8 = QMap<Qt::MouseButton,_QPointF>::value
                           (&this->mouseGrabberButtonDownPos,&button,&local_98);
      QGraphicsSceneMouseEvent::setButtonDownPos(mouseEvent,MVar4,&local_a8);
      MVar2 = button;
      local_c0 = QGraphicsSceneMouseEvent::scenePos(mouseEvent);
      local_a8 = QMap<Qt::MouseButton,_QPointF>::value
                           (&this->mouseGrabberButtonDownScenePos,&button,&local_c0);
      QGraphicsSceneMouseEvent::setButtonDownScenePos(mouseEvent,MVar2,&local_a8);
      MVar2 = button;
      QVar6 = QGraphicsSceneMouseEvent::screenPos(mouseEvent);
      local_c0.xp = (qreal)QVar6;
      QVar6 = QMap<Qt::MouseButton,_QPoint>::value
                        (&this->mouseGrabberButtonDownScreenPos,&button,(QPoint *)&local_c0);
      local_a8.xp = (qreal)QVar6;
      QGraphicsSceneMouseEvent::setButtonDownScreenPos(mouseEvent,MVar2,(QPoint *)&local_a8);
    }
    QGraphicsSceneMouseEvent::setPos(mouseEvent,&local_98);
    local_c0 = QGraphicsSceneMouseEvent::lastScenePos(mouseEvent);
    qVar11 = local_c0.yp;
    local_a8.xp = (qreal)QTransform::map((QPointF *)&mapFromScene);
    local_a8.yp = qVar11;
    QGraphicsSceneMouseEvent::setLastPos(mouseEvent,&local_a8);
    sendEvent(this,this_00,(QEvent *)mouseEvent);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00595a76:
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::sendMouseEvent(QGraphicsSceneMouseEvent *mouseEvent)
{
    if (mouseEvent->button() == 0 && mouseEvent->buttons() == 0 && lastMouseGrabberItemHasImplicitMouseGrab) {
        // ### This is a temporary fix for until we get proper mouse
        // grab events.
        clearMouseGrabber();
        return;
    }

    QGraphicsItem *item = mouseGrabberItems.constLast();
    if (item->isBlockedByModalPanel())
        return;

    const QTransform mapFromScene = item->d_ptr->genericMapFromSceneTransform(mouseEvent->widget());
    const QPointF itemPos = mapFromScene.map(mouseEvent->scenePos());
    for (int i = 0x1; i <= 0x10; i <<= 1) {
        Qt::MouseButton button = Qt::MouseButton(i);
        mouseEvent->setButtonDownPos(button, mouseGrabberButtonDownPos.value(button, itemPos));
        mouseEvent->setButtonDownScenePos(button, mouseGrabberButtonDownScenePos.value(button, mouseEvent->scenePos()));
        mouseEvent->setButtonDownScreenPos(button, mouseGrabberButtonDownScreenPos.value(button, mouseEvent->screenPos()));
    }
    mouseEvent->setPos(itemPos);
    mouseEvent->setLastPos(mapFromScene.map(mouseEvent->lastScenePos()));
    sendEvent(item, mouseEvent);
}